

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::Population(Population *this,int amount,string *modelName)

{
  bool bVar1;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *this_00;
  int in_ESI;
  undefined8 *in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  value_type *in_stack_fffffffffffffef8;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  LIF *in_stack_ffffffffffffff20;
  long in_stack_ffffffffffffff28;
  iaf_psc_alpha *in_stack_ffffffffffffff30;
  Population *in_stack_ffffffffffffff40;
  int local_a8;
  int local_a4;
  SignalGenerator *this_01;
  int local_74;
  int local_64;
  int local_54;
  int local_44;
  int local_34;
  int local_28;
  
  *in_RDI = &PTR_update_0012b920;
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x114a2f);
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  this_01 = (SignalGenerator *)(in_RDI + 6);
  std::vector<Neuron_*,_std::allocator<Neuron_*>_>::vector
            ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)0x114a53);
  *(int *)(in_RDI + 4) = in_ESI;
  local_a4 = in_ESI;
  if (*(int *)(in_RDI + 5) != 0) {
    local_a4 = *(int *)(in_RDI + 5);
  }
  *(int *)(in_RDI + 5) = local_a4;
  local_a8 = in_ESI;
  if (*(int *)((long)in_RDI + 0x24) != 0) {
    local_a8 = *(int *)((long)in_RDI + 0x24);
  }
  *(int *)((long)in_RDI + 0x24) = local_a8;
  initialize(in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
  if (bVar1) {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      operator_new(0x50);
      LIF::LIF(in_stack_ffffffffffffff20);
      std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8);
    }
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    if (bVar1) {
      for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
        operator_new(0x60);
        Izhikevich::Izhikevich
                  ((Izhikevich *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                  ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8);
      }
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      if (bVar1) {
        for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
          operator_new(0x60);
          CurrentGenerator::CurrentGenerator((CurrentGenerator *)this_01);
          std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                    ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8);
        }
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        if (bVar1) {
          for (local_54 = 0; local_54 < in_ESI; local_54 = local_54 + 1) {
            operator_new(0x60);
            SignalGenerator::SignalGenerator(this_01);
            std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                      ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8);
          }
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
          if (bVar1) {
            for (local_64 = 0; local_64 < in_ESI; local_64 = local_64 + 1) {
              operator_new(0x48);
              PassThrough::PassThrough((PassThrough *)in_stack_ffffffffffffff20);
              std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                        ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8);
            }
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
            if (bVar1) {
              for (local_74 = 0; local_74 < in_ESI; local_74 = local_74 + 1) {
                __x = (value_type *)(in_RDI + 6);
                this_00 = (vector<Neuron_*,_std::allocator<Neuron_*>_> *)operator_new(0x118);
                iaf_psc_alpha::iaf_psc_alpha
                          (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
                std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back(this_00,__x);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Population(int amount, std::string modelName) {
        numberOfNeurons = amount;
        numberOfOutputNeurons = numberOfOutputNeurons == 0? amount : numberOfOutputNeurons;
        numberOfInputNeurons = numberOfInputNeurons == 0? amount : numberOfInputNeurons;
        initialize();
        if(modelName == "iaf") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new LIF());
            }
        }
        else if(modelName == "izhikevich") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new Izhikevich((long)this, i));
            }
        }
        else if(modelName == "CurrentGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new CurrentGenerator());
            }
        }
        else if(modelName == "SignalGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new SignalGenerator());
            }
        }
        else if(modelName == "PassThrough") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new PassThrough());
            }
        }
        else if(modelName == "iaf_psc_alpha") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new iaf_psc_alpha((long)this, i));
            }
        }
    }